

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_draw_new(t_vu *x,_glist *glist)

{
  _glist *p_Var1;
  undefined8 in_stack_fffffffffffffe00;
  uint uVar3;
  ulong uVar2;
  undefined8 in_stack_fffffffffffffe08;
  uint uVar5;
  ulong uVar4;
  int local_1cc;
  char *pcStack_1c8;
  int i;
  char *tags [4];
  char tag_n [128];
  char tag [128];
  char tag_object [128];
  _glist *canvas;
  _glist *glist_local;
  t_vu *x_local;
  
  uVar5 = (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  uVar3 = (uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  p_Var1 = glist_getcanvas(glist);
  pcStack_1c8 = tag + 0x78;
  tags[0] = tag_n + 0x78;
  tags[1] = (char *)(tags + 3);
  tags[2] = "text";
  sprintf(tag + 0x78,"%lxOBJ",x);
  sprintf(tag_n + 0x78,"%lxBASE",x);
  uVar2 = (ulong)uVar3 << 0x20;
  uVar4 = (ulong)uVar5 << 0x20;
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,uVar2,uVar4,"-tags",2,
              &stack0xfffffffffffffe38);
  for (local_1cc = 1; local_1cc < 0x29; local_1cc = local_1cc + 1) {
    sprintf(tag_n + 0x78,"%lxRLED",x);
    sprintf((char *)(tags + 3),"%lxRLED%d",x);
    pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","line",0,0,uVar2 & 0xffffffff00000000,
                uVar4 & 0xffffffff00000000,"-tags",3,&stack0xfffffffffffffe38);
    sprintf(tag_n + 0x78,"%lxSCALE",x);
    sprintf((char *)(tags + 3),"%lxSCALE%d",x);
    uVar2 = 0;
    uVar4 = 0;
    pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",3,
                &stack0xfffffffffffffe38);
  }
  sprintf(tag_n + 0x78,"%lxSCALE",x);
  sprintf((char *)(tags + 3),"%lxSCALE%d",x);
  uVar2 = 0;
  uVar4 = 0;
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",3,
              &stack0xfffffffffffffe38);
  sprintf(tag_n + 0x78,"%lxRCOVER",x);
  uVar2 = uVar2 & 0xffffffff00000000;
  uVar4 = uVar4 & 0xffffffff00000000;
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,uVar2,uVar4,"-tags",2,
              &stack0xfffffffffffffe38);
  sprintf(tag_n + 0x78,"%lxPLED",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","line",0,0,uVar2 & 0xffffffff00000000,
              uVar4 & 0xffffffff00000000,"-tags",2,&stack0xfffffffffffffe38);
  sprintf(tag_n + 0x78,"%lxLABEL",x);
  sprintf((char *)(tags + 3),"label",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,
              &stack0xfffffffffffffe38);
  vu_draw_config(x,glist);
  vu_draw_io(x,glist,0);
  sys_queuegui(x,(x->x_gui).x_glist,vu_draw_update);
  return;
}

Assistant:

static void vu_draw_new(t_vu *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    char tag_object[128], tag[128], tag_n[128];
    char *tags[] = {tag_object, tag, tag_n, "text"};
    int i;

    sprintf(tag_object, "%lxOBJ", x);

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    for(i = 1; i < IEM_VU_STEPS+1; i++)
    {
        sprintf(tag, "%lxRLED", x);
        sprintf(tag_n, "%lxRLED%d", x, i);
        pdgui_vmess(0, "crr iiii rS", canvas, "create", "line",
            0, 0, 0, 0, "-tags", 3, tags);

        sprintf(tag, "%lxSCALE", x);
        sprintf(tag_n, "%lxSCALE%d", x, i);
        pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
            0, 0, "-anchor", "w", "-tags", 3, tags);
    }
    /* and a final scale item */
    sprintf(tag, "%lxSCALE", x);
    sprintf(tag_n, "%lxSCALE%d", x, i);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 3, tags);

    sprintf(tag, "%lxRCOVER", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxPLED", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "line",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxLABEL", x);
    sprintf(tag_n, "label", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    vu_draw_config(x, glist);
    vu_draw_io(x, glist, 0);
    sys_queuegui(x, x->x_gui.x_glist, vu_draw_update);
}